

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  ulong uVar2;
  undefined1 (*pauVar3) [64];
  uint uVar4;
  undefined1 (*pauVar5) [64];
  undefined1 (*pauVar6) [64];
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  
  uVar1 = a->c;
  uVar4 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar7 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar1) {
      uVar2 = 0;
      do {
        pauVar3 = (undefined1 (*) [64])(a->cstep * uVar2 * a->elemsize + (long)a->data);
        pauVar5 = (undefined1 (*) [64])(b->cstep * uVar2 * b->elemsize + (long)b->data);
        pauVar6 = (undefined1 (*) [64])(c->cstep * uVar2 * c->elemsize + (long)c->data);
        if ((int)uVar4 < 0x10) {
          uVar8 = 0;
        }
        else {
          iVar7 = 0xf;
          do {
            auVar11 = vaddps_avx512f(*pauVar5,*pauVar3);
            *pauVar6 = auVar11;
            pauVar3 = pauVar3 + 1;
            pauVar5 = pauVar5 + 1;
            pauVar6 = pauVar6 + 1;
            iVar7 = iVar7 + 0x10;
            uVar8 = uVar4 & 0xfffffff0;
          } while (iVar7 < (int)uVar4);
        }
        uVar10 = uVar8 | 7;
        while ((int)uVar10 < (int)uVar4) {
          auVar13._0_4_ = *(float *)*pauVar5 + *(float *)*pauVar3;
          auVar13._4_4_ = *(float *)(*pauVar5 + 4) + *(float *)(*pauVar3 + 4);
          auVar13._8_4_ = *(float *)(*pauVar5 + 8) + *(float *)(*pauVar3 + 8);
          auVar13._12_4_ = *(float *)(*pauVar5 + 0xc) + *(float *)(*pauVar3 + 0xc);
          auVar13._16_4_ = *(float *)(*pauVar5 + 0x10) + *(float *)(*pauVar3 + 0x10);
          auVar13._20_4_ = *(float *)(*pauVar5 + 0x14) + *(float *)(*pauVar3 + 0x14);
          auVar13._24_4_ = *(float *)(*pauVar5 + 0x18) + *(float *)(*pauVar3 + 0x18);
          auVar13._28_4_ = *(float *)(*pauVar5 + 0x1c) + *(float *)(*pauVar3 + 0x1c);
          *(undefined1 (*) [32])*pauVar6 = auVar13;
          pauVar3 = (undefined1 (*) [64])(*pauVar3 + 0x20);
          pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
          pauVar6 = (undefined1 (*) [64])((long)*pauVar6 + 0x20);
          uVar10 = uVar8 + 0xf;
          uVar8 = uVar8 + 8;
        }
        uVar10 = uVar8 | 3;
        while ((int)uVar10 < (int)uVar4) {
          auVar12._0_4_ = *(float *)*pauVar5 + *(float *)*pauVar3;
          auVar12._4_4_ = *(float *)(*pauVar5 + 4) + *(float *)(*pauVar3 + 4);
          auVar12._8_4_ = *(float *)(*pauVar5 + 8) + *(float *)(*pauVar3 + 8);
          auVar12._12_4_ = *(float *)(*pauVar5 + 0xc) + *(float *)(*pauVar3 + 0xc);
          *(undefined1 (*) [16])*pauVar6 = auVar12;
          pauVar3 = (undefined1 (*) [64])(*pauVar3 + 0x10);
          pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
          pauVar6 = (undefined1 (*) [64])((long)*pauVar6 + 0x10);
          uVar10 = uVar8 + 7;
          uVar8 = uVar8 + 4;
        }
        if (uVar4 - uVar8 != 0 && (int)uVar8 <= (int)uVar4) {
          lVar9 = 0;
          do {
            *(float *)((long)*pauVar6 + lVar9 * 4) =
                 *(float *)(*pauVar5 + lVar9 * 4) + *(float *)(*pauVar3 + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (uVar4 - uVar8 != (int)lVar9);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != uVar1);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}